

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::Table(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *o)

{
  size_t sVar1;
  InfoType IVar2;
  ulong uVar3;
  void *t;
  Node *pNVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->mKeyVals = (Node *)&this->mMask;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mMaxNumElementsAllowed = 0;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  if (o->mNumElements != 0) {
    uVar5 = o->mMask + 1;
    if (uVar5 < 0x28f5c28f5c28f5d) {
      uVar3 = (uVar5 * 0x50) / 100;
    }
    else {
      uVar3 = (uVar5 / 100) * 0x50;
    }
    uVar6 = 0xff;
    if (uVar3 < 0xff) {
      uVar6 = uVar3;
    }
    t = malloc((uVar6 + uVar5) * 0x29 + 8);
    pNVar4 = (Node *)assertNotNull<std::bad_alloc,void>(t);
    this->mKeyVals = pNVar4;
    this->mInfo = (uint8_t *)(pNVar4 + uVar6 + uVar5);
    sVar1 = o->mMask;
    this->mNumElements = o->mNumElements;
    this->mMask = sVar1;
    this->mMaxNumElementsAllowed = o->mMaxNumElementsAllowed;
    IVar2 = o->mInfoHashShift;
    this->mInfoInc = o->mInfoInc;
    this->mInfoHashShift = IVar2;
    cloneData(this,o);
    return;
  }
  return;
}

Assistant:

Table(const Table& o)
        : WHash(static_cast<const WHash&>(o))
        , WKeyEqual(static_cast<const WKeyEqual&>(o))
        , DataPool(static_cast<const DataPool&>(o)) {
        ROBIN_HOOD_TRACE(this)
        if (!o.empty()) {
            // not empty: create an exact copy. it is also possible to just iterate through all
            // elements and insert them, but copying is probably faster.

            auto const numElementsWithBuffer = calcNumElementsWithBuffer(o.mMask + 1);
            mKeyVals = static_cast<Node*>(detail::assertNotNull<std::bad_alloc>(
                std::malloc(calcNumBytesTotal(numElementsWithBuffer))));
            // no need for calloc because clonData does memcpy
            mInfo = reinterpret_cast<uint8_t*>(mKeyVals + numElementsWithBuffer);
            mNumElements = o.mNumElements;
            mMask = o.mMask;
            mMaxNumElementsAllowed = o.mMaxNumElementsAllowed;
            mInfoInc = o.mInfoInc;
            mInfoHashShift = o.mInfoHashShift;
            cloneData(o);
        }
    }